

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_lib.c
# Opt level: O0

int RSA_set0_crt_params(RSA *r,BIGNUM *dmp1,BIGNUM *dmq1,BIGNUM *iqmp)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  if ((((*(long *)(in_RDI + 0x50) == 0) && (in_RSI == 0)) ||
      ((*(long *)(in_RDI + 0x58) == 0 && (in_RDX == 0)))) ||
     ((*(long *)(in_RDI + 0x60) == 0 && (in_RCX == 0)))) {
    local_4 = 0;
  }
  else {
    if (in_RSI != 0) {
      BN_clear_free(*(BIGNUM **)(in_RDI + 0x50));
      *(long *)(in_RDI + 0x50) = in_RSI;
      BN_set_flags(*(BIGNUM **)(in_RDI + 0x50),4);
    }
    if (in_RDX != 0) {
      BN_clear_free(*(BIGNUM **)(in_RDI + 0x58));
      *(long *)(in_RDI + 0x58) = in_RDX;
      BN_set_flags(*(BIGNUM **)(in_RDI + 0x58),4);
    }
    if (in_RCX != 0) {
      BN_clear_free(*(BIGNUM **)(in_RDI + 0x60));
      *(long *)(in_RDI + 0x60) = in_RCX;
      BN_set_flags(*(BIGNUM **)(in_RDI + 0x60),4);
    }
    *(int *)(in_RDI + 0xd8) = *(int *)(in_RDI + 0xd8) + 1;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int RSA_set0_crt_params(RSA *r, BIGNUM *dmp1, BIGNUM *dmq1, BIGNUM *iqmp)
{
    /* If the fields dmp1, dmq1 and iqmp in r are NULL, the corresponding input
     * parameters MUST be non-NULL.
     */
    if ((r->dmp1 == NULL && dmp1 == NULL)
        || (r->dmq1 == NULL && dmq1 == NULL)
        || (r->iqmp == NULL && iqmp == NULL))
        return 0;

    if (dmp1 != NULL) {
        BN_clear_free(r->dmp1);
        r->dmp1 = dmp1;
        BN_set_flags(r->dmp1, BN_FLG_CONSTTIME);
    }
    if (dmq1 != NULL) {
        BN_clear_free(r->dmq1);
        r->dmq1 = dmq1;
        BN_set_flags(r->dmq1, BN_FLG_CONSTTIME);
    }
    if (iqmp != NULL) {
        BN_clear_free(r->iqmp);
        r->iqmp = iqmp;
        BN_set_flags(r->iqmp, BN_FLG_CONSTTIME);
    }
    r->dirty_cnt++;

    return 1;
}